

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall
t_lua_generator::generate_process_function
          (t_lua_generator *this,ostream *out,t_service *tservice,t_function *tfunction)

{
  string *__lhs;
  int *piVar1;
  t_struct *ptVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  pointer pptVar5;
  undefined4 extraout_var_00;
  t_lua_generator *this_00;
  const_iterator x_iter;
  pointer pptVar6;
  string fn_name;
  string resultname;
  string argsname;
  string classname;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130 [32];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar3),"Processor");
  __lhs = &tfunction->name_;
  std::operator+(&local_70,__lhs,"_args");
  std::operator+(&local_90,__lhs,"_result");
  std::__cxx11::string::string(local_130,(string *)__lhs);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"function ");
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,":process_");
  poVar4 = std::operator<<(poVar4,local_130);
  poVar4 = std::operator<<(poVar4,"(seqid, iprot, oprot, server_ctx)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1b0);
  poVar4 = std::operator<<(poVar4,"local args = ");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,":new{}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_190);
  poVar4 = std::operator<<(poVar4,"local reply_type = TMessageType.REPLY");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_170);
  poVar4 = std::operator<<(poVar4,"args:read(iprot)");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_150);
  poVar4 = std::operator<<(poVar4,"iprot:readMessageEnd()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  if (tfunction->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"local result = ");
    poVar4 = std::operator<<(poVar4,(string *)&local_90);
    poVar4 = std::operator<<(poVar4,":new{}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1b0);
  poVar4 = std::operator<<(poVar4,"local status, res = pcall(self.handler.");
  poVar4 = std::operator<<(poVar4,local_130);
  std::operator<<(poVar4,", self.handler");
  std::__cxx11::string::~string((string *)&local_1b0);
  ptVar2 = tfunction->arglist_;
  if ((ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    poVar4 = std::operator<<(out,", ");
    this_00 = (t_lua_generator *)0x2ed79e;
    std::__cxx11::string::string((string *)&local_b0,"args.",(allocator *)&local_190);
    argument_list(&local_1b0,this_00,ptVar2,&local_b0);
    std::operator<<(poVar4,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  poVar4 = std::operator<<(out,")");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  if (tfunction->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"if not status then");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_190);
    poVar4 = std::operator<<(poVar4,"  reply_type = TMessageType.EXCEPTION");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_170);
    poVar4 = std::operator<<(poVar4,"  result = TApplicationException:new{message = res}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    ptVar2 = tfunction->xceptions_;
    pptVar6 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pptVar5 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pptVar5 != pptVar6) {
      for (; pptVar6 != pptVar5; pptVar6 = pptVar6 + 1) {
        t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_1b0);
        poVar4 = std::operator<<(poVar4,"elseif ttype(res) == \'");
        iVar3 = (*((*pptVar6)->type_->super_t_doc)._vptr_t_doc[3])();
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
        poVar4 = std::operator<<(poVar4,"\' then");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_190);
        poVar4 = std::operator<<(poVar4,"  result.");
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
        poVar4 = std::operator<<(poVar4," = res");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        pptVar5 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1b0);
    poVar4 = std::operator<<(poVar4,"else");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_190);
    poVar4 = std::operator<<(poVar4,"  result.success = res");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_170);
    poVar4 = std::operator<<(poVar4,"end");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_150);
    poVar4 = std::operator<<(poVar4,"oprot:writeMessageBegin(\'");
    poVar4 = std::operator<<(poVar4,local_130);
    poVar4 = std::operator<<(poVar4,"\', reply_type, ");
    poVar4 = std::operator<<(poVar4,"seqid)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    poVar4 = std::operator<<(poVar4,"result:write(oprot)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_f0);
    poVar4 = std::operator<<(poVar4,"oprot:writeMessageEnd()");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_110);
    poVar4 = std::operator<<(poVar4,"oprot.trans:flush()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1b0);
  poVar4 = std::operator<<(poVar4,"return status, res");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"end");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_lua_generator::generate_process_function(ostream& out,
                                                t_service* tservice,
                                                t_function* tfunction) {
  string classname = tservice->get_name() + "Processor";
  string argsname = tfunction->get_name() + "_args";
  string resultname = tfunction->get_name() + "_result";
  string fn_name = tfunction->get_name();

  indent(out) << endl << "function " << classname << ":process_" << fn_name
              << "(seqid, iprot, oprot, server_ctx)" << endl;
  indent_up();

  // Read the request
  out << indent() << "local args = " << argsname << ":new{}" << endl << indent()
      << "local reply_type = TMessageType.REPLY" << endl << indent() << "args:read(iprot)" << endl
      << indent() << "iprot:readMessageEnd()" << endl;

  if (!tfunction->is_oneway()) {
      out << indent() << "local result = " << resultname
          << ":new{}" << endl;
  }

  out <<  indent() << "local status, res = pcall(self.handler." << fn_name
      << ", self.handler";
  // Print arguments
  t_struct* args = tfunction->get_arglist();
  if (args->get_members().size() > 0) {
    out << ", " << argument_list(args, "args.");
  }
  out << ")" << endl;

  if (!tfunction->is_oneway()) {
      // Check for errors
      out << indent() << "if not status then" << endl << indent()
          << "  reply_type = TMessageType.EXCEPTION" << endl << indent()
          << "  result = TApplicationException:new{message = res}" << endl;

      // Handle custom exceptions
      const std::vector<t_field*>& xf = tfunction->get_xceptions()->get_members();
      if (xf.size() > 0) {
          vector<t_field*>::const_iterator x_iter;
          for (x_iter = xf.begin(); x_iter != xf.end(); ++x_iter) {
              out << indent() << "elseif ttype(res) == '" << (*x_iter)->get_type()->get_name() << "' then"
                  << endl << indent() << "  result." << (*x_iter)->get_name() << " = res" << endl;
          }
      }

      // Set the result and write the reply
      out << indent() << "else" << endl << indent() << "  result.success = res" << endl << indent()
          << "end" << endl << indent() << "oprot:writeMessageBegin('" << fn_name << "', reply_type, "
          << "seqid)" << endl << indent() << "result:write(oprot)" << endl << indent()
          << "oprot:writeMessageEnd()" << endl << indent() << "oprot.trans:flush()" << endl;
  }
  out << indent() << "return status, res" << endl;
  indent_down();
  indent(out) << "end" << endl;
}